

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O1

void QtPrivate::
     q_relocate_overlap_n_left_move<std::reverse_iterator<QFileDialogPrivate::HistoryItem*>,long_long>
               (reverse_iterator<QFileDialogPrivate::HistoryItem_*> first,longlong n,
               reverse_iterator<QFileDialogPrivate::HistoryItem_*> d_first)

{
  HistoryItem *pHVar1;
  Data *pDVar2;
  undefined8 uVar3;
  char16_t *pcVar4;
  qsizetype qVar5;
  Data *pDVar6;
  QPersistentModelIndex *pQVar7;
  int *piVar8;
  HistoryItem *pHVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  reverse_iterator<QFileDialogPrivate::HistoryItem_*> *prVar12;
  HistoryItem *pHVar13;
  HistoryItem *pHVar14;
  long in_FS_OFFSET;
  Destructor local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.iter = &local_48.intermediate;
  local_48.end.current = (HistoryItem *)((d_first.current)->path).d.d;
  pHVar13 = local_48.end.current + -n;
  pHVar1 = (HistoryItem *)((first.current)->path).d.d;
  pHVar14 = pHVar1;
  pHVar9 = pHVar13;
  if (pHVar13 < pHVar1) {
    pHVar14 = pHVar13;
    pHVar9 = pHVar1;
  }
  pHVar1 = (HistoryItem *)((d_first.current)->path).d.d;
  while (pHVar1 != pHVar9) {
    pDVar2 = ((first.current)->path).d.d;
    uVar3 = *(undefined8 *)&pDVar2[-3].super_QArrayData;
    pDVar2[-3].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-3].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    *(undefined8 *)&pHVar1[-1].path.d.d = uVar3;
    pcVar4 = (char16_t *)pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = 0;
    pHVar1[-1].path.d.ptr = pcVar4;
    qVar5 = *(qsizetype *)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-2].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pHVar1[-1].path.d.size = qVar5;
    pDVar6 = (Data *)pDVar2[-2].super_QArrayData.alloc;
    pDVar2[-2].super_QArrayData.alloc = 0;
    pHVar1[-1].selection.d.d = pDVar6;
    pQVar7 = *(QPersistentModelIndex **)&pDVar2[-1].super_QArrayData;
    pDVar2[-1].super_QArrayData.ref_ = (Type)0x0;
    pDVar2[-1].super_QArrayData.flags = (QFlagsStorageHelper<QArrayData::ArrayOption,_4>)0x0;
    pHVar1[-1].selection.d.ptr = pQVar7;
    qVar5 = pDVar2[-1].super_QArrayData.alloc;
    pDVar2[-1].super_QArrayData.alloc = 0;
    pHVar1[-1].selection.d.size = qVar5;
    ((d_first.current)->path).d.d = ((d_first.current)->path).d.d + -3;
    ((first.current)->path).d.d = ((first.current)->path).d.d + -3;
    pHVar1 = (HistoryItem *)((d_first.current)->path).d.d;
  }
  local_48.intermediate.current = (HistoryItem *)((d_first.current)->path).d.d;
  while (pHVar1 = (HistoryItem *)((d_first.current)->path).d.d, prVar12 = &local_48.end,
        pHVar1 != pHVar13) {
    pDVar2 = ((first.current)->path).d.d;
    uVar3 = *(undefined8 *)&pHVar1[-1].path.d.d;
    *(undefined8 *)&pHVar1[-1].path.d.d = *(undefined8 *)&pDVar2[-3].super_QArrayData;
    pDVar2[-3].super_QArrayData.ref_ = (QBasicAtomicInt)(int)uVar3;
    pDVar2[-3].super_QArrayData.flags = (ArrayOptions)(int)((ulong)uVar3 >> 0x20);
    pcVar4 = pHVar1[-1].path.d.ptr;
    pHVar1[-1].path.d.ptr = (char16_t *)pDVar2[-3].super_QArrayData.alloc;
    pDVar2[-3].super_QArrayData.alloc = (qsizetype)pcVar4;
    uVar10 = *(undefined4 *)&pHVar1[-1].path.d.size;
    uVar11 = *(undefined4 *)((long)&pHVar1[-1].path.d.size + 4);
    pHVar1[-1].path.d.size = *(qsizetype *)&pDVar2[-2].super_QArrayData;
    pDVar2[-2].super_QArrayData.ref_ = (QBasicAtomicInt)uVar10;
    pDVar2[-2].super_QArrayData.flags = (ArrayOptions)uVar11;
    QArrayDataPointer<QPersistentModelIndex>::operator=
              (&pHVar1[-1].selection.d,
               (QArrayDataPointer<QPersistentModelIndex> *)&pDVar2[-2].super_QArrayData.alloc);
    ((d_first.current)->path).d.d = ((d_first.current)->path).d.d + -3;
    ((first.current)->path).d.d = ((first.current)->path).d.d + -3;
  }
  while (local_48.iter = prVar12, pHVar1 = (HistoryItem *)((first.current)->path).d.d,
        pHVar1 != pHVar14) {
    ((first.current)->path).d.d = (Data *)(pHVar1 + 1);
    QArrayDataPointer<QPersistentModelIndex>::~QArrayDataPointer(&(pHVar1->selection).d);
    piVar8 = *(int **)&(pHVar1->path).d.d;
    prVar12 = local_48.iter;
    if (piVar8 != (int *)0x0) {
      LOCK();
      *piVar8 = *piVar8 + -1;
      UNLOCK();
      if (*piVar8 == 0) {
        QArrayData::deallocate(*(QArrayData **)&(pHVar1->path).d.d,2,0x10);
        prVar12 = local_48.iter;
      }
    }
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QFileDialogPrivate::HistoryItem_*>,_long_long>
  ::Destructor::~Destructor(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}